

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_transport.c
# Opt level: O0

int tr_tcp_open(void *tr_socket)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  int iVar5;
  int *piVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  tr_tcp_socket *tmp_14;
  tr_tcp_socket *tmp_13;
  tr_tcp_socket *tmp_12;
  tr_tcp_socket *tmp_11;
  int socket_error;
  tr_tcp_socket *tmp_10;
  tr_tcp_socket *tmp_9;
  int ret;
  fd_set *__arr;
  uint __i;
  tr_tcp_socket *tmp_8;
  tr_tcp_socket *tmp_7;
  tr_tcp_socket *tmp_6;
  tr_tcp_socket *tmp_5;
  tr_tcp_socket *tmp_4;
  tr_tcp_socket *tmp_3;
  tr_tcp_socket *tmp_2;
  tr_tcp_socket *tmp_1;
  tr_tcp_socket *tmp;
  tr_tcp_config *config;
  tr_tcp_socket *tcp_socket;
  int tcp_rtval;
  int rtval;
  void *tr_socket_local;
  undefined1 auStack_e0 [4];
  int oldcancelstate;
  timeval timeout;
  addrinfo *bind_addrinfo;
  addrinfo *res;
  addrinfo hints;
  fd_set wfds;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tcp_socket._4_4_ = -1;
  if (*tr_socket != -1) {
    __assert_fail("tcp_socket->socket == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/transport/tcp/tcp_transport.c"
                  ,99,"int tr_tcp_open(void *)");
  }
  bind_addrinfo = (addrinfo *)0x0;
  timeout.tv_usec = 0;
  memset(&res,0,0x30);
  res._4_4_ = 0;
  hints.ai_flags = 1;
  res._0_4_ = 0x20;
  if (*(long *)((long)tr_socket + 0x28) != 0) {
    uVar4 = (**(code **)((long)tr_socket + 0x28))(*(undefined8 *)((long)tr_socket + 0x20));
    *(undefined4 *)tr_socket = uVar4;
    if (0 < *tr_socket) goto LAB_0010ba1e;
    uVar2 = *(undefined8 *)((long)tr_socket + 8);
    uVar3 = *(undefined8 *)((long)tr_socket + 0x10);
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    lrtr_dbg("TCP Transport(%s:%s): Couldn\'t establish TCP connection, %s",uVar2,uVar3,pcVar7);
    goto LAB_0010c207;
  }
LAB_0010ba1e:
  if (*tr_socket < 0) {
    iVar5 = getaddrinfo(*(char **)((long)tr_socket + 8),*(char **)((long)tr_socket + 0x10),
                        (addrinfo *)&res,(addrinfo **)&bind_addrinfo);
    if (iVar5 != 0) {
      if (iVar5 == -0xb) {
        uVar2 = *(undefined8 *)((long)tr_socket + 8);
        uVar3 = *(undefined8 *)((long)tr_socket + 0x10);
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        lrtr_dbg("TCP Transport(%s:%s): getaddrinfo error, %s",uVar2,uVar3,pcVar7);
      }
      else {
        uVar2 = *(undefined8 *)((long)tr_socket + 8);
        uVar3 = *(undefined8 *)((long)tr_socket + 0x10);
        pcVar7 = gai_strerror(iVar5);
        lrtr_dbg("TCP Transport(%s:%s): getaddrinfo error, %s",uVar2,uVar3,pcVar7);
      }
      tr_socket_local._0_4_ = -1;
      goto LAB_0010c254;
    }
    iVar5 = socket(bind_addrinfo->ai_family,bind_addrinfo->ai_socktype,bind_addrinfo->ai_protocol);
    *(int *)tr_socket = iVar5;
    if (*tr_socket == -1) {
      uVar2 = *(undefined8 *)((long)tr_socket + 8);
      uVar3 = *(undefined8 *)((long)tr_socket + 0x10);
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      lrtr_dbg("TCP Transport(%s:%s): Socket creation failed, %s",uVar2,uVar3,pcVar7);
    }
    else if (*(long *)((long)tr_socket + 0x18) == 0) {
LAB_0010bd99:
      iVar5 = set_socket_non_blocking(*tr_socket);
      if (iVar5 == -1) {
        uVar2 = *(undefined8 *)((long)tr_socket + 8);
        uVar3 = *(undefined8 *)((long)tr_socket + 0x10);
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        lrtr_dbg("TCP Transport(%s:%s): Could not set socket to non blocking, %s",uVar2,uVar3,pcVar7
                );
      }
      else {
        iVar5 = connect(*tr_socket,(sockaddr *)bind_addrinfo->ai_addr,bind_addrinfo->ai_addrlen);
        if ((iVar5 == -1) && (piVar6 = __errno_location(), *piVar6 != 0x73)) {
          uVar2 = *(undefined8 *)((long)tr_socket + 8);
          uVar3 = *(undefined8 *)((long)tr_socket + 0x10);
          piVar6 = __errno_location();
          pcVar7 = strerror(*piVar6);
          lrtr_dbg("TCP Transport(%s:%s): Couldn\'t establish TCP connection, %s",uVar2,uVar3,pcVar7
                  );
        }
        else {
          freeaddrinfo((addrinfo *)bind_addrinfo);
          bind_addrinfo = (addrinfo *)0x0;
          for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
            wfds.__fds_bits[(ulong)__arr._4_4_ - 1] = 0;
          }
          wfds.__fds_bits[(long)(*tr_socket / 0x40) + -1] =
               1L << ((byte)((long)*tr_socket % 0x40) & 0x3f) |
               wfds.__fds_bits[(long)(*tr_socket / 0x40) + -1];
          _auStack_e0 = (ulong)*(uint *)((long)tr_socket + 0x30);
          timeout.tv_sec = 0;
          pthread_setcancelstate(0,(int *)((long)&tr_socket_local + 4));
          iVar5 = select(*tr_socket + 1,(fd_set *)0x0,(fd_set *)&hints.ai_next,(fd_set *)0x0,
                         (timeval *)auStack_e0);
          pthread_setcancelstate(1,(int *)((long)&tr_socket_local + 4));
          if (iVar5 < 0) {
            uVar2 = *(undefined8 *)((long)tr_socket + 8);
            uVar3 = *(undefined8 *)((long)tr_socket + 0x10);
            piVar6 = __errno_location();
            pcVar7 = strerror(*piVar6);
            lrtr_dbg("TCP Transport(%s:%s): Could not select tcp socket, %s",uVar2,uVar3,pcVar7);
          }
          else if (iVar5 == 0) {
            lrtr_dbg("TCP Transport(%s:%s): Could not establish TCP connection in time",
                     *(undefined8 *)((long)tr_socket + 8),*(undefined8 *)((long)tr_socket + 0x10));
          }
          else {
            iVar5 = get_socket_error(*tr_socket);
            if (iVar5 == -1) {
              uVar2 = *(undefined8 *)((long)tr_socket + 8);
              uVar3 = *(undefined8 *)((long)tr_socket + 0x10);
              piVar6 = __errno_location();
              pcVar7 = strerror(*piVar6);
              lrtr_dbg("TCP Transport(%s:%s): Could not get socket error, %s",uVar2,uVar3,pcVar7);
            }
            else if (iVar5 < 1) {
              iVar5 = set_socket_blocking(*tr_socket);
              if (iVar5 != -1) goto LAB_0010c1c9;
              uVar2 = *(undefined8 *)((long)tr_socket + 8);
              uVar3 = *(undefined8 *)((long)tr_socket + 0x10);
              piVar6 = __errno_location();
              pcVar7 = strerror(*piVar6);
              lrtr_dbg("TCP Transport(%s:%s): Could not set socket to blocking, %s",uVar2,uVar3,
                       pcVar7);
            }
            else {
              uVar2 = *(undefined8 *)((long)tr_socket + 8);
              uVar3 = *(undefined8 *)((long)tr_socket + 0x10);
              pcVar7 = strerror(iVar5);
              lrtr_dbg("TCP Transport(%s:%s): Could not establish TCP connection, %s",uVar2,uVar3,
                       pcVar7);
            }
          }
        }
      }
    }
    else {
      iVar5 = getaddrinfo(*(char **)((long)tr_socket + 0x18),(char *)0x0,(addrinfo *)&res,
                          (addrinfo **)&timeout.tv_usec);
      if (iVar5 == 0) {
        iVar5 = bind(*tr_socket,*(sockaddr **)(timeout.tv_usec + 0x18),
                     *(socklen_t *)(timeout.tv_usec + 0x10));
        if (iVar5 == 0) {
          freeaddrinfo((addrinfo *)timeout.tv_usec);
          timeout.tv_usec = 0;
          goto LAB_0010bd99;
        }
        uVar2 = *(undefined8 *)((long)tr_socket + 8);
        uVar3 = *(undefined8 *)((long)tr_socket + 0x10);
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        lrtr_dbg("TCP Transport(%s:%s): Socket bind failed, %s",uVar2,uVar3,pcVar7);
      }
      else if (iVar5 == -0xb) {
        uVar2 = *(undefined8 *)((long)tr_socket + 8);
        uVar3 = *(undefined8 *)((long)tr_socket + 0x10);
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        lrtr_dbg("TCP Transport(%s:%s): getaddrinfo error, %s",uVar2,uVar3,pcVar7);
      }
      else {
        uVar2 = *(undefined8 *)((long)tr_socket + 8);
        uVar3 = *(undefined8 *)((long)tr_socket + 0x10);
        pcVar7 = gai_strerror(iVar5);
        lrtr_dbg("TCP Transport(%s:%s): getaddrinfo error, %s",uVar2,uVar3,pcVar7);
      }
    }
  }
  else {
LAB_0010c1c9:
    lrtr_dbg("TCP Transport(%s:%s): Connection established",*(undefined8 *)((long)tr_socket + 8),
             *(undefined8 *)((long)tr_socket + 0x10));
    tcp_socket._4_4_ = 0;
  }
LAB_0010c207:
  if (bind_addrinfo != (addrinfo *)0x0) {
    freeaddrinfo((addrinfo *)bind_addrinfo);
  }
  if (timeout.tv_usec != 0) {
    freeaddrinfo((addrinfo *)timeout.tv_usec);
  }
  if (tcp_socket._4_4_ == -1) {
    tr_tcp_close(tr_socket);
  }
  tr_socket_local._0_4_ = tcp_socket._4_4_;
LAB_0010c254:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (int)tr_socket_local;
}

Assistant:

int tr_tcp_open(void *tr_socket)
{
	int rtval = TR_ERROR;
	int tcp_rtval = 0;
	struct tr_tcp_socket *tcp_socket = tr_socket;
	const struct tr_tcp_config *config = &tcp_socket->config;

	assert(tcp_socket->socket == -1);

	struct addrinfo hints;
	struct addrinfo *res = NULL;
	struct addrinfo *bind_addrinfo = NULL;

	bzero(&hints, sizeof(hints));
	hints.ai_family = AF_UNSPEC;
	hints.ai_socktype = SOCK_STREAM;
	hints.ai_flags = AI_ADDRCONFIG;

	if (config->new_socket) {
		tcp_socket->socket = (*config->new_socket)(config->data);
		if (tcp_socket->socket <= 0) {
			TCP_DBG("Couldn't establish TCP connection, %s", tcp_socket, strerror(errno));
			goto end;
		}
	}
	if (tcp_socket->socket < 0) {
		tcp_rtval = getaddrinfo(config->host, config->port, &hints, &res);
		if (tcp_rtval != 0) {
			if (tcp_rtval == EAI_SYSTEM) {
				TCP_DBG("getaddrinfo error, %s", tcp_socket, strerror(errno));
			} else {
				TCP_DBG("getaddrinfo error, %s", tcp_socket, gai_strerror(tcp_rtval));
			}
			return TR_ERROR;
		}

		tcp_socket->socket = socket(res->ai_family, res->ai_socktype, res->ai_protocol);
		if (tcp_socket->socket == -1) {
			TCP_DBG("Socket creation failed, %s", tcp_socket, strerror(errno));
			goto end;
		}

		if (tcp_socket->config.bindaddr) {
			tcp_rtval = getaddrinfo(tcp_socket->config.bindaddr, 0, &hints, &bind_addrinfo);
			if (tcp_rtval != 0) {
				if (tcp_rtval == EAI_SYSTEM) {
					TCP_DBG("getaddrinfo error, %s", tcp_socket, strerror(errno));
				} else {
					TCP_DBG("getaddrinfo error, %s", tcp_socket, gai_strerror(tcp_rtval));
				}
				goto end;
			}
			if (bind(tcp_socket->socket, bind_addrinfo->ai_addr, bind_addrinfo->ai_addrlen) != 0) {
				TCP_DBG("Socket bind failed, %s", tcp_socket, strerror(errno));
				goto end;
			}

			freeaddrinfo(bind_addrinfo);
			bind_addrinfo = NULL;
		}

		if (set_socket_non_blocking(tcp_socket->socket) == TR_ERROR) {
			TCP_DBG("Could not set socket to non blocking, %s", tcp_socket, strerror(errno));
			goto end;
		}

		if (connect(tcp_socket->socket, res->ai_addr, res->ai_addrlen) == -1 && errno != EINPROGRESS) {
			TCP_DBG("Couldn't establish TCP connection, %s", tcp_socket, strerror(errno));
			goto end;
		}

		freeaddrinfo(res);
		res = NULL;

		fd_set wfds;

		FD_ZERO(&wfds);
		FD_SET(tcp_socket->socket, &wfds);

		struct timeval timeout = {.tv_sec = tcp_socket->config.connect_timeout, .tv_usec = 0};
		int oldcancelstate;

		/* Enable cancellability for the select call
		 * to prevent rtr_stop from blocking for a long time.
		 * It must be the only blocking call in this function.
		 * Since local resources have all been freed this should be safe.
		 */
		pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, &oldcancelstate);
		int ret = select(tcp_socket->socket + 1, NULL, &wfds, NULL, &timeout);

		pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, &oldcancelstate);

		if (ret < 0) {
			TCP_DBG("Could not select tcp socket, %s", tcp_socket, strerror(errno));
			goto end;

		} else if (ret == 0) {
			TCP_DBG("Could not establish TCP connection in time", tcp_socket);
			goto end;
		}

		int socket_error = get_socket_error(tcp_socket->socket);

		if (socket_error == TR_ERROR) {
			TCP_DBG("Could not get socket error, %s", tcp_socket, strerror(errno));
			goto end;

		} else if (socket_error > 0) {
			TCP_DBG("Could not establish TCP connection, %s", tcp_socket, strerror(socket_error));
			goto end;
		}

		if (set_socket_blocking(tcp_socket->socket) == TR_ERROR) {
			TCP_DBG("Could not set socket to blocking, %s", tcp_socket, strerror(errno));
			goto end;
		}
	}

	TCP_DBG1("Connection established", tcp_socket);
	rtval = TR_SUCCESS;

end:
	if (res)
		freeaddrinfo(res);

	if (bind_addrinfo)
		freeaddrinfo(bind_addrinfo);
	if (rtval == -1)
		tr_tcp_close(tr_socket);
	return rtval;
}